

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_declaration.h
# Opt level: O2

void __thiscall ncnn::Einsum_final::~Einsum_final(Einsum_final *this)

{
  ~Einsum_final((Einsum_final *)
                ((long)&this->_vptr_Einsum_final + (long)this->_vptr_Einsum_final[-3]));
  return;
}

Assistant:

virtual int create_pipeline(const Option& opt) {
        { int ret = Einsum::create_pipeline(opt); if (ret) return ret; }
        return 0;
    }